

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall
cmGraphVizWriter::WriteConnections
          (cmGraphVizWriter *this,string *targetName,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedNodes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedConnections,cmGeneratedFileStream *str)

{
  char *__s;
  const_iterator cVar1;
  const_iterator cVar2;
  iterator iVar3;
  ostream *poVar4;
  size_t sVar5;
  _Rb_tree_node_base *p_Var6;
  cmGlobalGenerator *globalGenerator;
  LinkLibraryScopeType *type;
  _Link_type __x;
  string connectionName;
  string myNodeName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
  ll;
  allocator<char> local_122;
  allocator<char> local_121;
  undefined1 local_120 [32];
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_100;
  cmGraphVizWriter *local_f8;
  _Base_ptr *local_f0 [2];
  _Base_ptr local_e0 [2];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d0;
  cmGlobalGenerator *local_c8;
  long local_c0;
  undefined1 local_b8 [56];
  key_type local_80;
  undefined1 local_60 [48];
  
  local_b8._24_8_ = &this->TargetPtrs;
  local_100 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)insertedConnections;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                  *)local_b8._24_8_,targetName);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header) {
    WriteNode(this,targetName,*(cmGeneratorTarget **)(cVar1._M_node + 2),insertedNodes,str);
    if (*(long *)(cVar1._M_node + 2) != 0) {
      local_b8._48_8_ = &this->TargetNamesNodes;
      local_d0 = insertedNodes;
      local_b8._16_8_ = targetName;
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_b8._48_8_,targetName);
      globalGenerator = (cmGlobalGenerator *)local_b8;
      local_c8 = globalGenerator;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,*(long *)(cVar2._M_node + 2),
                 (long)&(cVar2._M_node[2]._M_parent)->_M_color + *(long *)(cVar2._M_node + 2));
      __x = (_Link_type)**(undefined8 **)(cVar1._M_node + 2);
      local_f8 = this;
      (anonymous_namespace)::getScopedLinkLibrariesFromTarget_abi_cxx11_
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                  *)local_60,(_anonymous_namespace_ *)__x,(cmTarget *)this->GlobalGenerator,
                 globalGenerator);
      if ((_Rb_tree_node_base *)local_60._24_8_ != (_Rb_tree_node_base *)(local_60 + 8)) {
        local_b8._40_8_ = &(local_f8->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header;
        local_b8._32_8_ = local_100 + 8;
        p_Var6 = (_Rb_tree_node_base *)local_60._24_8_;
        do {
          __s = *(char **)(p_Var6 + 1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_f0,__s,(allocator<char> *)local_120);
          __x = (_Link_type)local_f0;
          cVar2 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_b8._48_8_,(key_type *)local_f0);
          if (local_f0[0] != local_e0) {
            __x = (_Link_type)((long)&local_e0[0]->_M_color + 1);
            operator_delete(local_f0[0],(ulong)__x);
          }
          if (cVar2._M_node != (_Base_ptr)local_b8._40_8_) {
            local_f0[0] = local_e0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_f0,local_c8,
                       (long)&local_c8->_vptr_cmGlobalGenerator + local_c0);
            std::__cxx11::string::append((char *)local_f0);
            std::__cxx11::string::_M_append((char *)local_f0,*(ulong *)(cVar2._M_node + 2));
            __x = (_Link_type)local_f0;
            iVar3 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_100,(key_type *)local_f0);
            if (iVar3._M_node == (_Base_ptr)local_b8._32_8_) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        (local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0);
              std::__cxx11::string::string<std::allocator<char>>((string *)local_120,__s,&local_121)
              ;
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_122)
              ;
              cVar1 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                              *)local_b8._24_8_,&local_80);
              WriteNode(local_f8,(string *)local_120,*(cmGeneratorTarget **)(cVar1._M_node + 2),
                        local_d0,str);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
                operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)str,"    \"",5);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)str,(char *)local_c8,local_c0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" -> \"",6);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,*(char **)(cVar2._M_node + 2),
                                  (long)cVar2._M_node[2]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
              (anonymous_namespace)::getLinkLibraryStyle_abi_cxx11_
                        ((string *)local_120,(_anonymous_namespace_ *)(ulong)p_Var6[2]._M_color,type
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)str,(char *)local_120._0_8_,local_120._8_8_);
              if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
                operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)str," // ",4);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)str,*(char **)local_b8._16_8_,
                                  *(size_type *)(local_b8._16_8_ + 8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
              if (__s == (char *)0x0) {
                std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
              }
              else {
                sVar5 = strlen(__s);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
              }
              std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              __x = (_Link_type)local_120;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__x,__s,(allocator<char> *)&local_80);
              WriteConnections(local_f8,(string *)__x,local_d0,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_100,str);
              if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
                __x = (_Link_type)(local_120._16_8_ + 1);
                operator_delete((void *)local_120._0_8_,(ulong)__x);
              }
            }
            if (local_f0[0] != local_e0) {
              __x = (_Link_type)((long)&local_e0[0]->_M_color + 1);
              operator_delete(local_f0[0],(ulong)__x);
            }
          }
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != (_Rb_tree_node_base *)(local_60 + 8));
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                  *)local_60._16_8_,__x);
      if (local_c8 != (cmGlobalGenerator *)local_b8) {
        operator_delete(local_c8,local_b8._0_8_ + 1);
      }
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteConnections(
  const std::string& targetName, std::set<std::string>& insertedNodes,
  std::set<std::string>& insertedConnections, cmGeneratedFileStream& str) const
{
  std::map<std::string, const cmGeneratorTarget*>::const_iterator targetPtrIt =
    this->TargetPtrs.find(targetName);

  if (targetPtrIt == this->TargetPtrs.end()) // not found at all
  {
    return;
  }

  this->WriteNode(targetName, targetPtrIt->second, insertedNodes, str);

  if (targetPtrIt->second == nullptr) // it's an external library
  {
    return;
  }

  std::string myNodeName = this->TargetNamesNodes.find(targetName)->second;
  std::map<std::string, LinkLibraryScopeType> ll =
    getScopedLinkLibrariesFromTarget(targetPtrIt->second->Target,
                                     GlobalGenerator);

  for (auto const& llit : ll) {
    const char* libName = llit.first.c_str();
    std::map<std::string, std::string>::const_iterator libNameIt =
      this->TargetNamesNodes.find(libName);

    // can happen e.g. if GRAPHVIZ_TARGET_IGNORE_REGEX is used
    if (libNameIt == this->TargetNamesNodes.end()) {
      continue;
    }

    std::string connectionName = myNodeName;
    connectionName += "-";
    connectionName += libNameIt->second;
    if (insertedConnections.find(connectionName) ==
        insertedConnections.end()) {
      insertedConnections.insert(connectionName);
      this->WriteNode(libName, this->TargetPtrs.find(libName)->second,
                      insertedNodes, str);

      str << "    \"" << myNodeName << "\" -> \"" << libNameIt->second << "\"";

      str << getLinkLibraryStyle(llit.second);

      str << " // " << targetName << " -> " << libName << std::endl;
      this->WriteConnections(libName, insertedNodes, insertedConnections, str);
    }
  }
}